

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_capacity_suite.cpp
# Opt level: O3

void size_suite::run(void)

{
  test_null();
  test_boolean();
  test_integer();
  test_real();
  test_string();
  test_wstring();
  test_u16string();
  test_u32string();
  test_array();
  test_array_with_size();
  test_map();
  return;
}

Assistant:

void run()
{
    test_null();
    test_boolean();
    test_integer();
    test_real();
    test_string();
    test_wstring();
    test_u16string();
    test_u32string();
    test_array();
    test_array_with_size();
    test_map();
}